

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmArray(ExpressionContext *ctx,VmModule *module,ExprArray *node)

{
  TypeBase *type;
  Allocator *allocator;
  SynBase *pSVar1;
  int iVar2;
  TypeBase *type_00;
  undefined4 extraout_var;
  VmInstruction *argument;
  VmConstant *value;
  VmValue *value_00;
  VmConstant *arrayLength;
  VmConstant *elementSize;
  VmConstant *index;
  TypeRef *structType;
  VmValue *address;
  VmInstruction *this;
  ExprBase *pEVar3;
  uint uVar4;
  VmType type_01;
  VmValue *in_stack_ffffffffffffff98;
  
  type_00 = (node->super_ExprBase).type;
  if ((type_00 != (TypeBase *)0x0) && (type_00->typeID == 0x13)) {
    if ((type_00 == (TypeBase *)0x0) || (type_00->typeID != 0x13)) {
      type_00 = (TypeBase *)0x0;
    }
    type = (TypeBase *)type_00[1]._vptr_TypeBase;
    if (((type == ctx->typeBool) || (type == ctx->typeChar)) || (type == ctx->typeShort)) {
      uVar4 = 1;
      value = anon_unknown.dwarf_233176::CreateAlloca
                        (ctx,module,(node->super_ExprBase).source,type_00,"arr_lit",true);
      pEVar3 = (node->values).head;
      if (pEVar3 != (ExprBase *)0x0) {
        iVar2 = 0;
        do {
          value_00 = CompileVm(ctx,module,pEVar3);
          arrayLength = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                          type_00[1].typeID);
          elementSize = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                          (int)type->size);
          index = CreateConstantInt(module->allocator,(node->super_ExprBase).source,iVar2);
          pSVar1 = (node->super_ExprBase).source;
          structType = ExpressionContext::GetReferenceType(ctx,type);
          address = anon_unknown.dwarf_233176::CreateIndex
                              (module,pSVar1,&arrayLength->super_VmValue,&elementSize->super_VmValue
                               ,&value->super_VmValue,&index->super_VmValue,
                               &structType->super_TypeBase);
          anon_unknown.dwarf_233176::CreateStore
                    (ctx,module,(node->super_ExprBase).source,type,address,value_00,0);
          uVar4 = (uint)value_00;
          iVar2 = iVar2 + 1;
          pEVar3 = pEVar3->next;
        } while (pEVar3 != (ExprBase *)0x0);
      }
      this = (VmInstruction *)
             anon_unknown.dwarf_233176::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,type_00,&value->super_VmValue,uVar4
                       );
    }
    else {
      iVar2 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x138);
      this = (VmInstruction *)CONCAT44(extraout_var,iVar2);
      allocator = module->allocator;
      type_01 = GetVmType(ctx,(node->super_ExprBase).type);
      pSVar1 = (node->super_ExprBase).source;
      uVar4 = module->currentFunction->nextInstructionId;
      module->currentFunction->nextInstructionId = uVar4 + 1;
      VmInstruction::VmInstruction(this,allocator,type_01,pSVar1,VM_INST_ARRAY,uVar4);
      for (pEVar3 = (node->values).head; pEVar3 != (ExprBase *)0x0; pEVar3 = pEVar3->next) {
        argument = (VmInstruction *)CompileVm(ctx,module,pEVar3);
        if (type == ctx->typeFloat) {
          argument = anon_unknown.dwarf_233176::CreateInstruction
                               ((anon_unknown_dwarf_233176 *)module,
                                (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                                (VmType)(ZEXT816(0x11) << 0x40),(VmInstructionType)argument,
                                (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                in_stack_ffffffffffffff98);
        }
        VmInstruction::AddArgument(this,&argument->super_VmValue);
      }
      VmBlock::AddInstruction(module->currentBlock,this);
    }
    anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,&this->super_VmValue);
    return &this->super_VmValue;
  }
  __assert_fail("isType<TypeArray>(node->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xa23,"VmValue *CompileVmArray(ExpressionContext &, VmModule *, ExprArray *)");
}

Assistant:

VmValue* CompileVmArray(ExpressionContext &ctx, VmModule *module, ExprArray *node)
{
	assert(isType<TypeArray>(node->type));

	TypeArray *typeArray = getType<TypeArray>(node->type);

	TypeBase *elementType = typeArray->subType;

	if(elementType == ctx.typeBool || elementType == ctx.typeChar || elementType == ctx.typeShort)
	{
		VmValue *storage = CreateAlloca(ctx, module, node->source, typeArray, "arr_lit", true);

		unsigned i = 0;

		for(ExprBase *value = node->values.head; value; value = value->next)
		{
			VmValue *element = CompileVm(ctx, module, value);

			VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(typeArray->length));
			VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(elementType->size));
			VmValue *index = CreateConstantInt(module->allocator, node->source, i);

			VmValue *address = CreateIndex(module, node->source, arrayLength, elementSize, storage, index, ctx.GetReferenceType(elementType));

			CreateStore(ctx, module, node->source, elementType, address, element, 0);

			i++;
		}

		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, typeArray, storage, 0));
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_ARRAY, module->currentFunction->nextInstructionId++);

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		VmValue *element = CompileVm(ctx, module, value);

		if(elementType == ctx.typeFloat)
			element = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, element);

		inst->AddArgument(element);
	}

	module->currentBlock->AddInstruction(inst);

	return CheckType(ctx, node, inst);
}